

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc.hpp
# Opt level: O3

void __thiscall cppjit::builder::gcc::gcc(gcc *this,string *kernel_name)

{
  builder::builder(&this->super_builder,kernel_name,false);
  (this->super_builder)._vptr_builder = (_func_int **)&PTR_compile_impl_0010ad38;
  (this->compiler)._M_dataplus._M_p = (pointer)&(this->compiler).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->compiler,"g++","");
  (this->linker)._M_dataplus._M_p = (pointer)&(this->linker).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->linker,"g++","");
  (this->cpp_flags)._M_dataplus._M_p = (pointer)&(this->cpp_flags).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->cpp_flags,"-std=c++14 -fPIC -fno-gnu-unique","");
  (this->link_flags)._M_dataplus._M_p = (pointer)&(this->link_flags).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->link_flags,"-shared -fno-gnu-unique","");
  (this->include_paths)._M_dataplus._M_p = (pointer)&(this->include_paths).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->include_paths,"");
  (this->library_paths)._M_dataplus._M_p = (pointer)&(this->library_paths).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->library_paths,"");
  (this->libraries)._M_dataplus._M_p = (pointer)&(this->libraries).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->libraries,"");
  return;
}

Assistant:

gcc(const std::string &kernel_name) : builder(kernel_name) {}